

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

char * concat_url(char *base,char *relurl)

{
  char *__haystack;
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  char *sep;
  int level;
  char *url_clone;
  size_t urllen;
  char *useurl;
  _Bool host_changed;
  size_t newlen;
  char *pathsep;
  char *protsep;
  char *newest;
  char *relurl_local;
  char *base_local;
  
  useurl._7_1_ = 0;
  __haystack = (*Curl_cstrdup)(base);
  if (__haystack == (char *)0x0) {
    base_local = (char *)0x0;
  }
  else {
    pcVar1 = strstr(__haystack,"//");
    pathsep = __haystack;
    if (pcVar1 != (char *)0x0) {
      pathsep = pcVar1 + 2;
    }
    urllen = (size_t)relurl;
    if (*relurl == '/') {
      if ((*relurl == '/') && (relurl[1] == '/')) {
        *pathsep = '\0';
        urllen = (size_t)(relurl + 2);
        useurl._7_1_ = 1;
      }
      else {
        newlen = (size_t)strchr(pathsep,0x2f);
        if ((char *)newlen == (char *)0x0) {
          pcVar1 = strchr(pathsep,0x3f);
          if (pcVar1 != (char *)0x0) {
            *pcVar1 = '\0';
          }
        }
        else {
          pcVar1 = strchr(pathsep,0x3f);
          if ((pcVar1 != (char *)0x0) && (pcVar1 < newlen)) {
            newlen = (size_t)pcVar1;
          }
          *(undefined1 *)newlen = 0;
        }
      }
    }
    else {
      sep._4_4_ = 0;
      pcVar1 = strchr(pathsep,0x3f);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      if ((*relurl != '?') && (pcVar1 = strrchr(pathsep,0x2f), pcVar1 != (char *)0x0)) {
        *pcVar1 = '\0';
      }
      pcVar1 = strchr(pathsep,0x2f);
      if (pcVar1 == (char *)0x0) {
        pathsep = (char *)0x0;
      }
      else {
        pathsep = pcVar1 + 1;
      }
      if ((*relurl == '.') && (relurl[1] == '/')) {
        urllen = (size_t)(relurl + 2);
      }
      while( true ) {
        bVar3 = false;
        if ((*(char *)urllen == '.') && (bVar3 = false, *(char *)(urllen + 1) == '.')) {
          bVar3 = *(char *)(urllen + 2) == '/';
        }
        if (!bVar3) break;
        sep._4_4_ = sep._4_4_ + 1;
        urllen = urllen + 3;
      }
      if (pathsep != (char *)0x0) {
        while (sep._4_4_ != 0) {
          pcVar1 = strrchr(pathsep,0x2f);
          if (pcVar1 == (char *)0x0) {
            *pathsep = '\0';
            break;
          }
          *pcVar1 = '\0';
          sep._4_4_ = sep._4_4_ + -1;
        }
      }
    }
    sVar2 = strlen_url((char *)urllen,(_Bool)((useurl._7_1_ ^ 0xff) & 1));
    url_clone = (char *)strlen(__haystack);
    base_local = (char *)(*Curl_cmalloc)((size_t)(url_clone + sVar2 + 2));
    if (base_local == (char *)0x0) {
      (*Curl_cfree)(__haystack);
      base_local = (char *)0x0;
    }
    else {
      memcpy(base_local,__haystack,(size_t)url_clone);
      if ((*(char *)urllen != '/') &&
         (((pathsep == (char *)0x0 || (*pathsep != '\0')) && (*(char *)urllen != '?')))) {
        base_local[(long)url_clone] = '/';
        url_clone = url_clone + 1;
      }
      strcpy_url(base_local + (long)url_clone,(char *)urllen,(_Bool)((useurl._7_1_ ^ 0xff) & 1));
      (*Curl_cfree)(__haystack);
    }
  }
  return base_local;
}

Assistant:

static char *concat_url(const char *base, const char *relurl)
{
  /***
   TRY to append this new path to the old URL
   to the right of the host part. Oh crap, this is doomed to cause
   problems in the future...
  */
  char *newest;
  char *protsep;
  char *pathsep;
  size_t newlen;
  bool host_changed = FALSE;

  const char *useurl = relurl;
  size_t urllen;

  /* we must make our own copy of the URL to play with, as it may
     point to read-only data */
  char *url_clone = strdup(base);

  if(!url_clone)
    return NULL; /* skip out of this NOW */

  /* protsep points to the start of the host name */
  protsep = strstr(url_clone, "//");
  if(!protsep)
    protsep = url_clone;
  else
    protsep += 2; /* pass the slashes */

  if('/' != relurl[0]) {
    int level = 0;

    /* First we need to find out if there's a ?-letter in the URL,
       and cut it and the right-side of that off */
    pathsep = strchr(protsep, '?');
    if(pathsep)
      *pathsep = 0;

    /* we have a relative path to append to the last slash if there's one
       available, or if the new URL is just a query string (starts with a
       '?')  we append the new one at the end of the entire currently worked
       out URL */
    if(useurl[0] != '?') {
      pathsep = strrchr(protsep, '/');
      if(pathsep)
        *pathsep = 0;
    }

    /* Check if there's any slash after the host name, and if so, remember
       that position instead */
    pathsep = strchr(protsep, '/');
    if(pathsep)
      protsep = pathsep + 1;
    else
      protsep = NULL;

    /* now deal with one "./" or any amount of "../" in the newurl
       and act accordingly */

    if((useurl[0] == '.') && (useurl[1] == '/'))
      useurl += 2; /* just skip the "./" */

    while((useurl[0] == '.') &&
          (useurl[1] == '.') &&
          (useurl[2] == '/')) {
      level++;
      useurl += 3; /* pass the "../" */
    }

    if(protsep) {
      while(level--) {
        /* cut off one more level from the right of the original URL */
        pathsep = strrchr(protsep, '/');
        if(pathsep)
          *pathsep = 0;
        else {
          *protsep = 0;
          break;
        }
      }
    }
  }
  else {
    /* We got a new absolute path for this server */

    if((relurl[0] == '/') && (relurl[1] == '/')) {
      /* the new URL starts with //, just keep the protocol part from the
         original one */
      *protsep = 0;
      useurl = &relurl[2]; /* we keep the slashes from the original, so we
                              skip the new ones */
      host_changed = TRUE;
    }
    else {
      /* cut off the original URL from the first slash, or deal with URLs
         without slash */
      pathsep = strchr(protsep, '/');
      if(pathsep) {
        /* When people use badly formatted URLs, such as
           "http://www.url.com?dir=/home/daniel" we must not use the first
           slash, if there's a ?-letter before it! */
        char *sep = strchr(protsep, '?');
        if(sep && (sep < pathsep))
          pathsep = sep;
        *pathsep = 0;
      }
      else {
        /* There was no slash. Now, since we might be operating on a badly
           formatted URL, such as "http://www.url.com?id=2380" which doesn't
           use a slash separator as it is supposed to, we need to check for a
           ?-letter as well! */
        pathsep = strchr(protsep, '?');
        if(pathsep)
          *pathsep = 0;
      }
    }
  }

  /* If the new part contains a space, this is a mighty stupid redirect
     but we still make an effort to do "right". To the left of a '?'
     letter we replace each space with %20 while it is replaced with '+'
     on the right side of the '?' letter.
  */
  newlen = strlen_url(useurl, !host_changed);

  urllen = strlen(url_clone);

  newest = malloc(urllen + 1 + /* possible slash */
                  newlen + 1 /* zero byte */);

  if(!newest) {
    free(url_clone); /* don't leak this */
    return NULL;
  }

  /* copy over the root url part */
  memcpy(newest, url_clone, urllen);

  /* check if we need to append a slash */
  if(('/' == useurl[0]) || (protsep && !*protsep) || ('?' == useurl[0]))
    ;
  else
    newest[urllen++]='/';

  /* then append the new piece on the right side */
  strcpy_url(&newest[urllen], useurl, !host_changed);

  free(url_clone);

  return newest;
}